

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_info.cpp
# Opt level: O0

ostream * CMU462::Collada::operator<<(ostream *os,LightInfo *light)

{
  ostream *poVar1;
  Vector3D *v;
  ostream *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"LightInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,")");
  std::operator<<(in_RDI," [");
  v = (Vector3D *)(ulong)*(uint *)(in_RSI + 0x48);
  switch(v) {
  case (Vector3D *)0x0:
    std::operator<<(in_RDI,"type=none");
  case (Vector3D *)0x1:
    poVar1 = std::operator<<(in_RDI," type=ambient");
    std::operator<<(poVar1," spectrum=");
    CMU462::operator<<(in_RSI,(Spectrum *)v);
    break;
  case (Vector3D *)0x2:
    poVar1 = std::operator<<(in_RDI," type=directional");
    std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(in_RSI,(Spectrum *)v);
    std::operator<<(poVar1," direction=");
    CMU462::operator<<(in_RSI,v);
    break;
  case (Vector3D *)0x3:
    poVar1 = std::operator<<(in_RDI," type=area");
    std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(in_RSI,(Spectrum *)v);
    std::operator<<(poVar1," direction=");
    CMU462::operator<<(in_RSI,v);
    break;
  case (Vector3D *)0x4:
    poVar1 = std::operator<<(in_RDI," type=point");
    std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(in_RSI,(Spectrum *)v);
    std::operator<<(poVar1," position=");
    poVar1 = CMU462::operator<<(in_RSI,v);
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xa8));
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xac));
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xb0));
    break;
  case (Vector3D *)0x5:
    poVar1 = std::operator<<(in_RDI," type=spot");
    std::operator<<(poVar1," spectrum=");
    poVar1 = CMU462::operator<<(in_RSI,(Spectrum *)v);
    std::operator<<(poVar1," position=");
    poVar1 = CMU462::operator<<(in_RSI,v);
    std::operator<<(poVar1," direction=");
    poVar1 = CMU462::operator<<(in_RSI,v);
    poVar1 = std::operator<<(poVar1," falloff_deg=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xa0));
    poVar1 = std::operator<<(poVar1," falloff_exp=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xa4));
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xa8));
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xac));
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xb0));
  }
  std::operator<<(in_RDI," ]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LightInfo& light) {
  os << "LightInfo: " << light.name << " (id:" << light.id << ")";

  os << " [";

  switch (light.light_type) {
    case LightType::NONE:
      os << "type=none";
    case LightType::AMBIENT:
      os << " type=ambient"
         << " spectrum=" << light.spectrum;
      break;
    case LightType::DIRECTIONAL:
      os << " type=directional"
         << " spectrum=" << light.spectrum << " direction=" << light.direction;
      break;
    case LightType::AREA:
      os << " type=area"
         << " spectrum=" << light.spectrum << " direction=" << light.direction;
      break;
    case LightType::POINT:
      os << " type=point"
         << " spectrum=" << light.spectrum << " position=" << light.position
         << " constant_att=" << light.constant_att
         << " linear_att=" << light.linear_att
         << " quadratic_att=" << light.quadratic_att;
      break;
    case LightType::SPOT:
      os << " type=spot"
         << " spectrum=" << light.spectrum << " position=" << light.position
         << " direction=" << light.direction
         << " falloff_deg=" << light.falloff_deg
         << " falloff_exp=" << light.falloff_exp
         << " constant_att=" << light.constant_att
         << " linear_att=" << light.linear_att
         << " quadratic_att=" << light.quadratic_att;
      break;
  }

  os << " ]";

  return os;
}